

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O2

void __thiscall
node::MiniMiner::MiniMiner
          (MiniMiner *this,
          vector<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
          *manual_entries,
          map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
          *descendant_caches)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pMVar3;
  size_type sVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Txid *__x;
  MiniMinerMempoolEntry *entry;
  pointer __args_1;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_bool> pVar7;
  iterator desc_it;
  vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  descendants;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> local_60;
  value_type local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_ready_to_calculate = true;
  p_Var1 = &(this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_to_be_replaced)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_inclusion_order)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_bump_fees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_in_block)._M_t._M_impl.super__Rb_tree_header;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_in_block)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_total_fees = 0;
  this->m_total_vsize = 0;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var2 = &(this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header;
  (this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_entries).
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_entries).
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_entries).
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_descendant_set_by_txid)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar3 = (manual_entries->
           super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args_1 = (manual_entries->
                  super__Vector_base<node::MiniMinerMempoolEntry,_std::allocator<node::MiniMinerMempoolEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start; __args_1 != pMVar3;
      __args_1 = __args_1 + 1) {
    __x = &((__args_1->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->hash;
    sVar4 = std::
            map<transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_std::set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>_>_>_>
            ::count(descendant_caches,__x);
    if (sVar4 == 0) goto LAB_007b3fd3;
    pVar7 = std::
            _Rb_tree<uint256,std::pair<uint256_const,node::MiniMinerMempoolEntry>,std::_Select1st<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::less<uint256>,std::allocator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
            ::
            _M_emplace_unique<transaction_identifier<false>const&,node::MiniMinerMempoolEntry_const&>
                      ((_Rb_tree<uint256,std::pair<uint256_const,node::MiniMinerMempoolEntry>,std::_Select1st<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::less<uint256>,std::allocator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>
                        *)&this->m_entries_by_txid,__x,__args_1);
    local_58._M_node = (_Base_ptr)pVar7.first._M_node;
    uStack_50 = CONCAT71(uStack_50._1_7_,pVar7.second);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
      ::push_back(&this->m_entries,&local_58);
    }
  }
  for (p_Var6 = (descendant_caches->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(descendant_caches->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
    if (p_Var6[3]._M_parent == (_Base_ptr)0x0) goto LAB_007b3fd3;
    local_48 = 0;
    local_58._M_node = (_Base_ptr)0x0;
    uStack_50 = 0;
    for (p_Var5 = p_Var6[2]._M_right; p_Var5 != (_Base_ptr)&p_Var6[2]._M_parent;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      local_60._M_node =
           (_Base_ptr)
           std::
           _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
           ::find(&(this->m_entries_by_txid)._M_t,(key_type *)(p_Var5 + 1));
      if ((_Rb_tree_header *)local_60._M_node == p_Var1) {
        this->m_ready_to_calculate = false;
        goto LAB_007b3fb7;
      }
      std::
      vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
      ::emplace_back<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>&>
                ((vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                  *)&local_58,&local_60);
    }
    std::
    _Rb_tree<uint256,std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>,std::_Select1st<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>>
    ::
    _M_emplace_unique<transaction_identifier<false>const&,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>&>
              ((_Rb_tree<uint256,std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>,std::_Select1st<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::vector<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>>>>
                *)&this->m_descendant_set_by_txid,(transaction_identifier<false> *)(p_Var6 + 1),
               (vector<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                *)&local_58);
LAB_007b3fb7:
    std::
    _Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::~_Vector_base((_Vector_base<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
                     *)&local_58);
    if (p_Var5 != (_Base_ptr)&p_Var6[2]._M_parent) goto LAB_007b3fe7;
  }
  SanityCheck(this);
LAB_007b3fe7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_007b3fd3:
  this->m_ready_to_calculate = false;
  goto LAB_007b3fe7;
}

Assistant:

MiniMiner::MiniMiner(const std::vector<MiniMinerMempoolEntry>& manual_entries,
                     const std::map<Txid, std::set<Txid>>& descendant_caches)
{
    for (const auto& entry : manual_entries) {
        const auto& txid = entry.GetTx().GetHash();
        // We need to know the descendant set of every transaction.
        if (!Assume(descendant_caches.count(txid) > 0)) {
            m_ready_to_calculate = false;
            return;
        }
        // Just forward these args onto MiniMinerMempoolEntry
        auto [mapiter, success] = m_entries_by_txid.emplace(txid, entry);
        // Txids must be unique; this txid shouldn't already be an entry in m_entries_by_txid
        if (Assume(success)) m_entries.push_back(mapiter);
    }
    // Descendant cache is already built, but we need to translate them to m_entries_by_txid iters.
    for (const auto& [txid, desc_txids] : descendant_caches) {
        // Descendant cache should include at least the tx itself.
        if (!Assume(!desc_txids.empty())) {
            m_ready_to_calculate = false;
            return;
        }
        std::vector<MockEntryMap::iterator> descendants;
        for (const auto& desc_txid : desc_txids) {
            auto desc_it{m_entries_by_txid.find(desc_txid)};
            // Descendants should only include transactions with corresponding entries.
            if (!Assume(desc_it != m_entries_by_txid.end())) {
                m_ready_to_calculate = false;
                return;
            } else {
                descendants.emplace_back(desc_it);
            }
        }
        m_descendant_set_by_txid.emplace(txid, descendants);
    }
    Assume(m_to_be_replaced.empty());
    Assume(m_requested_outpoints_by_txid.empty());
    Assume(m_bump_fees.empty());
    Assume(m_inclusion_order.empty());
    SanityCheck();
}